

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_match.c
# Opt level: O2

int match_ref(size_t offset,size_t offset_top,PCRE2_SPTR8 eptr,match_block_8 *mb,BOOL caseless,
             size_t *lengthptr)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  size_t sVar8;
  long lVar9;
  uint *puVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  if (offset < offset_top) {
    sVar8 = mb->ovector[offset];
    if (sVar8 != 0xffffffffffffffff) {
      pbVar5 = mb->start_subject + sVar8;
      sVar4 = mb->ovector[offset + 1];
      lVar11 = sVar4 - sVar8;
      if (caseless == 0) {
        pbVar6 = eptr + lVar11;
        lVar9 = 0;
        while (lVar11 != lVar9) {
          pbVar7 = eptr + lVar9;
          if (mb->end_subject <= pbVar7) {
            return 1;
          }
          pbVar1 = pbVar5 + lVar9;
          lVar9 = lVar9 + 1;
          if (*pbVar1 != *pbVar7) {
            return -1;
          }
        }
      }
      else if ((mb->poptions >> 0x13 & 1) == 0) {
        pbVar6 = eptr + lVar11;
        for (lVar9 = 0; lVar11 != lVar9; lVar9 = lVar9 + 1) {
          if (mb->end_subject <= eptr + lVar9) {
            return 1;
          }
          if (mb->lcc[pbVar5[lVar9]] != mb->lcc[eptr[lVar9]]) {
            return -1;
          }
        }
      }
      else {
        pbVar6 = eptr;
        while (pbVar5 < mb->start_subject + sVar4) {
          if (mb->end_subject <= pbVar6) {
            return 1;
          }
          pbVar7 = pbVar6 + 1;
          bVar2 = *pbVar6;
          uVar12 = (uint)bVar2;
          if (0xbf < bVar2) {
            uVar12 = (uint)bVar2;
            if ((bVar2 & 0x20) == 0) {
              pbVar7 = pbVar6 + 2;
              uVar12 = (uVar12 & 0x1f) << 6 | pbVar6[1] & 0x3f;
            }
            else {
              uVar13 = *pbVar7 & 0x3f;
              if ((bVar2 & 0x10) == 0) {
                uVar12 = pbVar6[2] & 0x3f | uVar13 << 6 | (bVar2 & 0xf) << 0xc;
                pbVar7 = pbVar6 + 3;
              }
              else if ((bVar2 & 8) == 0) {
                uVar12 = pbVar6[3] & 0x3f |
                         (pbVar6[2] & 0x3f) << 6 | uVar13 << 0xc | (uVar12 & 7) << 0x12;
                pbVar7 = pbVar6 + 4;
              }
              else if ((bVar2 & 4) == 0) {
                uVar12 = (pbVar6[3] & 0x3f) << 6 |
                         (pbVar6[2] & 0x3f) << 0xc | uVar13 << 0x12 | (uVar12 & 3) << 0x18 |
                         pbVar6[4] & 0x3f;
                pbVar7 = pbVar6 + 5;
              }
              else {
                uVar12 = pbVar6[5] & 0x3f |
                         (pbVar6[4] & 0x3f) << 6 |
                         (pbVar6[3] & 0x3f) << 0xc |
                         (pbVar6[2] & 0x3f) << 0x12 | uVar13 << 0x18 | (bVar2 & 1) << 0x1e;
                pbVar7 = pbVar6 + 6;
              }
            }
          }
          pbVar6 = pbVar5 + 1;
          bVar2 = *pbVar5;
          uVar13 = (uint)bVar2;
          if (0xbf < bVar2) {
            uVar13 = (uint)bVar2;
            if ((bVar2 & 0x20) == 0) {
              pbVar6 = pbVar5 + 2;
              uVar13 = (uVar13 & 0x1f) << 6 | pbVar5[1] & 0x3f;
            }
            else {
              uVar14 = *pbVar6 & 0x3f;
              if ((bVar2 & 0x10) == 0) {
                uVar13 = pbVar5[2] & 0x3f | uVar14 << 6 | (bVar2 & 0xf) << 0xc;
                pbVar6 = pbVar5 + 3;
              }
              else if ((bVar2 & 8) == 0) {
                uVar13 = pbVar5[3] & 0x3f |
                         (pbVar5[2] & 0x3f) << 6 | uVar14 << 0xc | (uVar13 & 7) << 0x12;
                pbVar6 = pbVar5 + 4;
              }
              else if ((bVar2 & 4) == 0) {
                uVar13 = (pbVar5[3] & 0x3f) << 6 |
                         (pbVar5[2] & 0x3f) << 0xc | uVar14 << 0x12 | (uVar13 & 3) << 0x18 |
                         pbVar5[4] & 0x3f;
                pbVar6 = pbVar5 + 5;
              }
              else {
                uVar13 = pbVar5[5] & 0x3f |
                         (pbVar5[4] & 0x3f) << 6 |
                         (pbVar5[3] & 0x3f) << 0xc |
                         (pbVar5[2] & 0x3f) << 0x12 | uVar14 << 0x18 | (bVar2 & 1) << 0x1e;
                pbVar6 = pbVar5 + 6;
              }
            }
          }
          pbVar5 = pbVar6;
          pbVar6 = pbVar7;
          if ((uVar12 != uVar13) &&
             (uVar3 = *(ushort *)
                       ((long)_pcre2_ucd_stage2_8 +
                       (ulong)((uint)""[uVar13 >> 7] * 0x100 + (uVar13 & 0x7f) * 2)),
             uVar12 != uVar13 + _pcre2_ucd_records_8[uVar3].other_case)) {
            puVar10 = _pcre2_ucd_caseless_sets_8 + _pcre2_ucd_records_8[uVar3].caseset;
            do {
              uVar13 = *puVar10;
              if (uVar12 < uVar13) {
                return -1;
              }
              puVar10 = puVar10 + 1;
            } while (uVar12 != uVar13);
          }
        }
      }
      sVar8 = (long)pbVar6 - (long)eptr;
      goto LAB_0012c0da;
    }
  }
  if ((mb->poptions >> 9 & 1) == 0) {
    return -1;
  }
  sVar8 = 0;
LAB_0012c0da:
  *lengthptr = sVar8;
  return 0;
}

Assistant:

static int
match_ref(PCRE2_SIZE offset, PCRE2_SIZE offset_top, register PCRE2_SPTR eptr,
  match_block *mb, BOOL caseless, PCRE2_SIZE *lengthptr)
{
#if defined SUPPORT_UNICODE
BOOL utf = (mb->poptions & PCRE2_UTF) != 0;
#endif

register PCRE2_SPTR p;
PCRE2_SIZE length;
PCRE2_SPTR eptr_start = eptr;

/* Deal with an unset group. The default is no match, but there is an option to
match an empty string. */

if (offset >= offset_top || mb->ovector[offset] == PCRE2_UNSET)
  {
  if ((mb->poptions & PCRE2_MATCH_UNSET_BACKREF) != 0)
    {
    *lengthptr = 0;
    return 0;      /* Match */
    }
  else return -1;  /* No match */
  }

/* Separate the caseless and UTF cases for speed. */

p = mb->start_subject + mb->ovector[offset];
length = mb->ovector[offset+1] - mb->ovector[offset];

if (caseless)
  {
#if defined SUPPORT_UNICODE
  if (utf)
    {
    /* Match characters up to the end of the reference. NOTE: the number of
    code units matched may differ, because in UTF-8 there are some characters
    whose upper and lower case versions code have different numbers of bytes.
    For example, U+023A (2 bytes in UTF-8) is the upper case version of U+2C65
    (3 bytes in UTF-8); a sequence of 3 of the former uses 6 bytes, as does a
    sequence of two of the latter. It is important, therefore, to check the
    length along the reference, not along the subject (earlier code did this
    wrong). */

    PCRE2_SPTR endptr = p + length;
    while (p < endptr)
      {
      uint32_t c, d;
      const ucd_record *ur;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      GETCHARINC(c, eptr);
      GETCHARINC(d, p);
      ur = GET_UCD(d);
      if (c != d && c != d + ur->other_case)
        {
        const uint32_t *pp = PRIV(ucd_caseless_sets) + ur->caseset;
        for (;;)
          {
          if (c < *pp) return -1;  /* No match */
          if (c == *pp++) break;
          }
        }
      }
    }
  else
#endif

    /* Not in UTF mode */

    {
    while (length-- > 0)
      {
      uint32_t cc, cp;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      cc = UCHAR21TEST(eptr);
      cp = UCHAR21TEST(p);
      if (TABLE_GET(cp, mb->lcc, cp) != TABLE_GET(cc, mb->lcc, cc))
        return -1;  /* No match */
      p++;
      eptr++;
      }
    }
  }

/* In the caseful case, we can just compare the code units, whether or not we
are in UT mode. */

else
  {
  while (length-- > 0)
    {
    if (eptr >= mb->end_subject) return 1;   /* Partial match */
    if (UCHAR21INCTEST(p) != UCHAR21INCTEST(eptr)) return -1;  /*No match */
    }
  }

*lengthptr = eptr - eptr_start;
return 0;  /* Match */
}